

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O0

void __thiscall
miniros::IntraProcessSubscriberLink::IntraProcessSubscriberLink
          (IntraProcessSubscriberLink *this,PublicationPtr *parent)

{
  element_type *this_00;
  string *psVar1;
  SubscriberLink *in_RSI;
  weak_ptr<miniros::Publication> *in_RDI;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *__r;
  
  SubscriberLink::SubscriberLink(in_RSI);
  (in_RDI->super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__IntraProcessSubscriberLink_0061eb38;
  __r = &in_RDI[8].super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<miniros::IntraProcessPublisherLink>::shared_ptr
            ((shared_ptr<miniros::IntraProcessPublisherLink> *)0x451a70);
  *(undefined1 *)
   &in_RDI[9].super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       0;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x451a88);
  std::weak_ptr<miniros::Publication>::operator=(in_RDI,(shared_ptr<miniros::Publication> *)__r);
  this_00 = std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x451aa5);
  psVar1 = Publication::getName_abi_cxx11_(this_00);
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[6].super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(string *)psVar1);
  return;
}

Assistant:

IntraProcessSubscriberLink::IntraProcessSubscriberLink(const PublicationPtr& parent)
: dropped_(false)
{
  MINIROS_ASSERT(parent);
  parent_ = parent;
  topic_ = parent->getName();
}